

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_point_query_base.h
# Opt level: O0

void __thiscall
S2ClosestPointQueryBase<S2MinDistance,_int>::MaybeAddResult
          (S2ClosestPointQueryBase<S2MinDistance,_int> *this,PointData *point_data)

{
  Target *pTVar1;
  uint uVar2;
  int iVar3;
  S2Point *pSVar4;
  Options *pOVar5;
  PointData *pPVar6;
  size_type sVar7;
  const_reference this_00;
  S2MinDistance SVar8;
  Delta DVar9;
  undefined1 local_38 [8];
  Result result;
  S2Region *region;
  S2MinDistance distance;
  PointData *point_data_local;
  S2ClosestPointQueryBase<S2MinDistance,_int> *this_local;
  
  region = (S2Region *)(this->distance_limit_).super_S1ChordAngle.length2_;
  pTVar1 = this->target_;
  distance.super_S1ChordAngle.length2_ = (S1ChordAngle)(S1ChordAngle)point_data;
  pSVar4 = S2PointIndex<int>::PointData::point(point_data);
  uVar2 = (*pTVar1->_vptr_S2DistanceTarget[3])(pTVar1,pSVar4,&region);
  if ((uVar2 & 1) != 0) {
    pOVar5 = options(this);
    pPVar6 = (PointData *)S2ClosestPointQueryBaseOptions<S2MinDistance>::region(pOVar5);
    result.point_data_ = pPVar6;
    if (pPVar6 != (PointData *)0x0) {
      pSVar4 = S2PointIndex<int>::PointData::point
                         ((PointData *)distance.super_S1ChordAngle.length2_);
      uVar2 = (*(*(_func_int ***)&(pPVar6->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>)[8])
                        (pPVar6,pSVar4);
      if ((uVar2 & 1) == 0) {
        return;
      }
    }
    Result::Result((Result *)local_38,(S2MinDistance)region,
                   (PointData *)distance.super_S1ChordAngle.length2_);
    pOVar5 = options(this);
    iVar3 = S2ClosestPointQueryBaseOptions<S2MinDistance>::max_results(pOVar5);
    if (iVar3 == 1) {
      (this->result_singleton_).distance_.super_S1ChordAngle.length2_ = (double)local_38;
      (this->result_singleton_).point_data_ =
           (PointData *)result.distance_.super_S1ChordAngle.length2_;
      SVar8 = Result::distance((Result *)local_38);
      pOVar5 = options(this);
      DVar9 = S2ClosestPointQueryBaseOptions<S2MinDistance>::max_error(pOVar5);
      SVar8 = ::operator-(SVar8,(S1ChordAngle)DVar9.length2_);
      (this->distance_limit_).super_S1ChordAngle.length2_ =
           (double)SVar8.super_S1ChordAngle.length2_;
    }
    else {
      pOVar5 = options(this);
      iVar3 = S2ClosestPointQueryBaseOptions<S2MinDistance>::max_results(pOVar5);
      if (iVar3 == 0x7fffffff) {
        std::
        vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
        ::push_back(&this->result_vector_,(value_type *)local_38);
      }
      else {
        sVar7 = std::
                priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                ::size(&this->result_set_);
        pOVar5 = options(this);
        iVar3 = S2ClosestPointQueryBaseOptions<S2MinDistance>::max_results(pOVar5);
        if ((ulong)(long)iVar3 <= sVar7) {
          std::
          priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ::pop(&this->result_set_);
        }
        std::
        priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
        ::push(&this->result_set_,(value_type *)local_38);
        sVar7 = std::
                priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                ::size(&this->result_set_);
        pOVar5 = options(this);
        iVar3 = S2ClosestPointQueryBaseOptions<S2MinDistance>::max_results(pOVar5);
        if ((ulong)(long)iVar3 <= sVar7) {
          this_00 = std::
                    priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                    ::top(&this->result_set_);
          SVar8 = Result::distance(this_00);
          pOVar5 = options(this);
          DVar9 = S2ClosestPointQueryBaseOptions<S2MinDistance>::max_error(pOVar5);
          SVar8 = ::operator-(SVar8,(S1ChordAngle)DVar9.length2_);
          (this->distance_limit_).super_S1ChordAngle.length2_ =
               (double)SVar8.super_S1ChordAngle.length2_;
        }
      }
    }
  }
  return;
}

Assistant:

void S2ClosestPointQueryBase<Distance, Data>::MaybeAddResult(
    const PointData* point_data) {
  Distance distance = distance_limit_;
  if (!target_->UpdateMinDistance(point_data->point(), &distance)) return;

  const S2Region* region = options().region();
  if (region && !region->Contains(point_data->point())) return;

  Result result(distance, point_data);
  if (options().max_results() == 1) {
    // Optimization for the common case where only the closest point is wanted.
    result_singleton_ = result;
    distance_limit_ = result.distance() - options().max_error();
  } else if (options().max_results() == Options::kMaxMaxResults) {
    result_vector_.push_back(result);  // Sort/unique at end.
  } else {
    // Add this point to result_set_.  Note that with the current algorithm
    // each candidate point is considered at most once (except for one special
    // case where max_results() == 1, see InitQueue for details), so we don't
    // need to worry about possibly adding a duplicate entry here.
    if (result_set_.size() >= options().max_results()) {
      result_set_.pop();  // Replace the furthest result point.
    }
    result_set_.push(result);
    if (result_set_.size() >= options().max_results()) {
      distance_limit_ = result_set_.top().distance() - options().max_error();
    }
  }
}